

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O3

string * Assimp::DefaultIOSystem::fileName(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  long lVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  lVar2 = std::__cxx11::string::find_last_of
                    ((char *)__return_storage_ptr__,0x1f0b20,0xffffffffffffffff);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultIOSystem::fileName(const std::string& path)
{
    std::string ret = path;
    std::size_t last = ret.find_last_of("\\/");
    if (last != std::string::npos) ret = ret.substr(last + 1);
    return ret;
}